

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O0

void fromHalfZigZag_scalar(uint16_t *src,float *dst)

{
  float *in_RSI;
  float fVar1;
  
  fVar1 = half_to_float(0);
  *in_RSI = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[1] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[2] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[3] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[4] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[5] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[6] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[7] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[8] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[9] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[10] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0xb] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0xc] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0xd] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0xe] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0xf] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x10] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x11] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x12] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x13] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x14] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x15] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x16] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x17] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x18] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x19] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x1a] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x1b] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x1c] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x1d] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x1e] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x1f] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x20] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x21] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x22] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x23] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x24] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x25] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x26] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x27] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x28] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x29] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x2a] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x2b] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x2c] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x2d] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x2e] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x2f] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x30] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x31] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x32] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x33] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x34] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x35] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x36] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x37] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x38] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x39] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x3a] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x3b] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x3c] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x3d] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x3e] = fVar1;
  fVar1 = half_to_float(0);
  in_RSI[0x3f] = fVar1;
  return;
}

Assistant:

static void
fromHalfZigZag_scalar (uint16_t* src, float* dst)
{
    dst[0] = half_to_float (src[0]);
    dst[1] = half_to_float (src[1]);
    dst[2] = half_to_float (src[5]);
    dst[3] = half_to_float (src[6]);
    dst[4] = half_to_float (src[14]);
    dst[5] = half_to_float (src[15]);
    dst[6] = half_to_float (src[27]);
    dst[7] = half_to_float (src[28]);
    dst[8] = half_to_float (src[2]);
    dst[9] = half_to_float (src[4]);

    dst[10] = half_to_float (src[7]);
    dst[11] = half_to_float (src[13]);
    dst[12] = half_to_float (src[16]);
    dst[13] = half_to_float (src[26]);
    dst[14] = half_to_float (src[29]);
    dst[15] = half_to_float (src[42]);
    dst[16] = half_to_float (src[3]);
    dst[17] = half_to_float (src[8]);
    dst[18] = half_to_float (src[12]);
    dst[19] = half_to_float (src[17]);

    dst[20] = half_to_float (src[25]);
    dst[21] = half_to_float (src[30]);
    dst[22] = half_to_float (src[41]);
    dst[23] = half_to_float (src[43]);
    dst[24] = half_to_float (src[9]);
    dst[25] = half_to_float (src[11]);
    dst[26] = half_to_float (src[18]);
    dst[27] = half_to_float (src[24]);
    dst[28] = half_to_float (src[31]);
    dst[29] = half_to_float (src[40]);

    dst[30] = half_to_float (src[44]);
    dst[31] = half_to_float (src[53]);
    dst[32] = half_to_float (src[10]);
    dst[33] = half_to_float (src[19]);
    dst[34] = half_to_float (src[23]);
    dst[35] = half_to_float (src[32]);
    dst[36] = half_to_float (src[39]);
    dst[37] = half_to_float (src[45]);
    dst[38] = half_to_float (src[52]);
    dst[39] = half_to_float (src[54]);

    dst[40] = half_to_float (src[20]);
    dst[41] = half_to_float (src[22]);
    dst[42] = half_to_float (src[33]);
    dst[43] = half_to_float (src[38]);
    dst[44] = half_to_float (src[46]);
    dst[45] = half_to_float (src[51]);
    dst[46] = half_to_float (src[55]);
    dst[47] = half_to_float (src[60]);
    dst[48] = half_to_float (src[21]);
    dst[49] = half_to_float (src[34]);

    dst[50] = half_to_float (src[37]);
    dst[51] = half_to_float (src[47]);
    dst[52] = half_to_float (src[50]);
    dst[53] = half_to_float (src[56]);
    dst[54] = half_to_float (src[59]);
    dst[55] = half_to_float (src[61]);
    dst[56] = half_to_float (src[35]);
    dst[57] = half_to_float (src[36]);
    dst[58] = half_to_float (src[48]);
    dst[59] = half_to_float (src[49]);

    dst[60] = half_to_float (src[57]);
    dst[61] = half_to_float (src[58]);
    dst[62] = half_to_float (src[62]);
    dst[63] = half_to_float (src[63]);
}